

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result * __thiscall
testing::internal::
ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
::
Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
::Perform(Result *__return_storage_ptr__,
         Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
         *this,ArgumentTuple *param_1)

{
  bool bVar1;
  ostream *poVar2;
  GTestLog local_14;
  
  bVar1 = IsTrue((bool)(this->performed_ ^ 1));
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
                       ,0x2c5);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Condition !performed_ failed. ");
    std::operator<<(poVar2,"A ByMove() action should only be performed once.");
    GTestLog::~GTestLog(&local_14);
  }
  this->performed_ = true;
  std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::__uniq_ptr_impl
            ((__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)
             __return_storage_ptr__,
             (__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)
             (this->wrapper_).
             super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  return __return_storage_ptr__;
}

Assistant:

Result Perform(const ArgumentTuple&) override {
      GTEST_CHECK_(!performed_)
          << "A ByMove() action should only be performed once.";
      performed_ = true;
      return std::move(wrapper_->payload);
    }